

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(longlong lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  long in_RSI;
  longlong in_RDI;
  longlong ret;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  longlong *in_stack_ffffffffffffffb8;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffc0;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffc8;
  long *u;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  longlong local_18;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  long local_8;
  
  local_18 = in_RDI;
  local_10.m_int = in_RSI;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_20);
  rhs_00.m_int = local_10.m_int;
  bVar1 = DivisionCornerCaseHelper<long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_18,local_10,&local_20);
  if (bVar1) {
    local_8 = local_20.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::DivisionCornerCase2(local_10.m_int,rhs_00,in_stack_ffffffffffffffc8);
    if (bVar1) {
      local_8 = local_20.m_int;
    }
    else {
      u = (long *)0x0;
      this = (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             SafeInt::operator_cast_to_long(in_stack_ffffffffffffffc0);
      DivisionHelper<long_long,_long,_5>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((longlong *)local_10.m_int,u,(longlong *)this);
      SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
                (this,in_stack_ffffffffffffffb8);
    }
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}